

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O1

int fy_fetch_value(fy_parser *fyp,int c)

{
  fy_token_list *fytl;
  uint uVar1;
  list_head *plVar2;
  list_head *plVar3;
  byte bVar4;
  int iVar5;
  fy_simple_key *pfVar6;
  fy_atom *pfVar7;
  fy_token *pfVar8;
  fy_atom *pfVar9;
  int line;
  undefined8 uVar10;
  uint *handle;
  char *pcVar11;
  fy_error_module indent;
  fy_input *pfVar12;
  fy_input *pfVar13;
  fy_simple_key *_n;
  bool bVar14;
  ushort uVar15;
  list_head *plVar16;
  undefined1 local_118 [8];
  undefined8 uStack_110;
  char *pcStack_108;
  fy_input *pfStack_100;
  char *pcStack_f8;
  fy_input *pfStack_f0;
  char *pcStack_e8;
  code *pcStack_e0;
  undefined1 auStack_d8 [8];
  fy_diag_report_ctx _drc;
  undefined1 local_90 [8];
  fy_token_list sk_tl;
  ulong local_58;
  fy_token *local_50;
  ulong local_48;
  _Bool local_39;
  undefined4 local_38;
  _Bool did_purge;
  
  handle = (uint *)auStack_d8;
  if (c == 0x3a) {
    if (fyp == (fy_parser *)0x0) {
LAB_0013042b:
      plVar16 = (list_head *)0x0;
      local_58 = 0;
      pfVar12 = (fy_input *)0x0;
LAB_00130434:
      local_90 = (undefined1  [8])local_90;
      sk_tl._lh.next = (list_head *)local_90;
      if ((fyp->flow_level == 0) || (fyp->indent < fyp->column)) {
        pcStack_e0 = (code *)0x130464;
        iVar5 = fy_purge_stale_simple_keys(fyp,&local_39,FYTT_VALUE);
        if (iVar5 == 0) {
          pfVar6 = (fy_simple_key *)(fyp->simple_keys)._lh.next;
          if (pfVar6 == (fy_simple_key *)&fyp->simple_keys) {
            pfVar6 = (fy_simple_key *)0x0;
          }
          _n = (fy_simple_key *)0x0;
          if (pfVar6 != (fy_simple_key *)0x0) {
            if (pfVar6->flow_level == fyp->flow_level) {
              plVar2 = (pfVar6->node).next;
              plVar3 = (pfVar6->node).prev;
              plVar2->prev = plVar3;
              plVar3->next = plVar2;
              (pfVar6->node).next = (list_head *)0x0;
              (pfVar6->node).prev = (list_head *)0x0;
              (pfVar6->node).next = &pfVar6->node;
              (pfVar6->node).prev = &pfVar6->node;
              _n = pfVar6;
            }
            else {
              _n = (fy_simple_key *)0x0;
            }
          }
          if (_n == (fy_simple_key *)0x0) {
            pcStack_e8 = (char *)(ulong)(uint)fyp->flow_level;
            pfStack_f0 = (fy_input *)0x130692;
            fy_parser_diag(fyp,0x20,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                           ,0x7ed,"fy_fetch_value","no simple key flow_level=%d");
            pfVar13 = pfVar12;
            sk_tl._lh.prev = plVar16;
            local_48 = local_58;
            if ((fyp->queued_tokens)._lh.next == &(fyp->queued_tokens)._lh) {
              local_50 = (fy_token *)0x0;
            }
            else {
              local_50 = (fy_token *)(fyp->queued_tokens)._lh.prev;
            }
          }
          else {
            if ((_n->field_0x3c & 2) == 0) {
              pcStack_e0 = (code *)0x130d00;
              __assert_fail("fysk->possible",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                            ,0x7f3,"int fy_fetch_value(struct fy_parser *, int)");
            }
            pcStack_e8 = (char *)(ulong)(uint)fyp->flow_level;
            if (_n->flow_level != fyp->flow_level) {
              pcStack_e0 = (code *)0x130d1f;
              __assert_fail("fysk->flow_level == fyp->flow_level",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                            ,0x7f4,"int fy_fetch_value(struct fy_parser *, int)");
            }
            local_50 = _n->token;
            sk_tl._lh.prev = (list_head *)(_n->mark).input_pos;
            local_58 = (ulong)(uint)(_n->mark).line;
            uVar1 = (_n->mark).column;
            local_48 = (ulong)(uint)(_n->end_mark).line;
            pfVar12 = (fy_input *)(ulong)(uint)(_n->end_mark).column;
            pfStack_f0 = (fy_input *)0x130659;
            fy_parser_diag(fyp,0x20,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                           ,0x7f9,"fy_fetch_value","have simple key flow_level=%d");
            pfVar13 = (fy_input *)(ulong)uVar1;
          }
          pcStack_f8 = (char *)(ulong)(uint)fyp->flow_level;
          pcStack_e8 = (char *)(ulong)(uint)fyp->indent;
          bVar14 = false;
          uVar10 = 0x7fd;
          pfStack_100 = (fy_input *)0x13070f;
          pfStack_f0 = pfVar13;
          fy_parser_diag(fyp,0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                         ,0x7fd,"fy_fetch_value","flow_level=%d, column=%d parse_indent=%d");
          iVar5 = fyp->pending_complex_key_column;
          if ((-1 < iVar5) && (bVar14 = true, fyp->flow_level == 0)) {
            bVar14 = fyp->column <= (fyp->pending_complex_key_mark).column;
          }
          uVar15 = *(ushort *)&fyp->field_0x70;
          did_purge = true;
          indent = (fy_error_module)pfVar13;
          if (fyp->flow_level == 0) {
            bVar4 = (byte)((uVar15 & 0x20) >> 5);
            local_38 = (undefined4)CONCAT71((int7)((ulong)uVar10 >> 8),fyp->indent < (int)indent);
          }
          else {
            local_38 = 0;
            bVar4 = 1;
          }
          uVar1 = fyp->line;
          pcStack_e8 = (char *)(ulong)uVar1;
          if ((iVar5 < 0 & bVar4) == 0) {
            did_purge = (_Bool)((bVar14 ^ 1U) & -1 < iVar5);
          }
          pcStack_f8 = (char *)local_48;
          pcStack_108 = (char *)local_58;
          uStack_110._0_4_ = 0x1307c8;
          uStack_110._4_4_ = 0;
          pfStack_100 = pfVar13;
          pfStack_f0 = pfVar12;
          fy_parser_diag(fyp,0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                         ,0x80a,"fy_fetch_value",
                         "mark_insert.line=%d/%d mark_end_insert.line=%d/%d fyp->line=%d");
          pcStack_e8 = "true";
          local_118 = (undefined1  [8])0x14ae2b;
          if ((*(ushort *)&fyp->field_0x70 & 8) == 0) {
            local_118 = (undefined1  [8])0x14c507;
          }
          uStack_110 = "false";
          if (-1 < iVar5) {
            uStack_110 = "true";
          }
          pcStack_108 = "true";
          if (bVar14 == false) {
            pcStack_108 = "false";
          }
          pfStack_100 = (fy_input *)0x14ae2b;
          if ((int)uVar1 <= (int)local_48) {
            pfStack_100 = (fy_input *)0x14c507;
          }
          pcStack_f8 = "true";
          if ((uVar15 & 0x20) == 0) {
            pcStack_f8 = "false";
          }
          pfStack_f0 = (fy_input *)0x14ae2b;
          if ((char)local_38 == '\0') {
            pfStack_f0 = (fy_input *)0x14c507;
          }
          if (did_purge == false) {
            pcStack_e8 = "false";
          }
          pfVar9 = (fy_atom *)local_118;
          fy_parser_diag(fyp,0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                         ,0x814,"fy_fetch_value",
                         "simple_key_allowed=%s is_complex=%s final_complex_key=%s is_multiline=%s has_bmap=%s push_bmap_start=%s push_key_only=%s"
                        );
          handle = (uint *)auStack_d8;
          pfVar7 = (fy_atom *)auStack_d8;
          if (((iVar5 < 0) && ((int)local_48 < (int)uVar1)) &&
             ((fyp->flow_level == 0 || (fyp->flow != FYFT_MAP)))) {
            _drc.type = FYET_DEBUG;
            _drc.module = FYEM_UNKNOWN;
            _drc.fyt = (fy_token *)0x0;
            _drc.has_override = false;
            _drc._17_7_ = 0;
            _drc.override_file = (char *)0x0;
            auStack_d8 = (undefined1  [8])0x200000004;
            pfVar7 = fy_fill_atom_at(fyp,0,1,(fy_atom *)local_118);
            _drc._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar7);
            fy_parser_diag_report
                      (fyp,(fy_diag_report_ctx *)auStack_d8,"Illegal placement of \':\' indicator");
            iVar5 = -1;
            goto LAB_001305c4;
          }
          bVar4 = did_purge;
          if ((char)local_38 != '\0') {
            if (fyp->flow_level != 0) {
              pcStack_e0 = fy_fetch_anchor_or_alias;
              __assert_fail("!fyp->flow_level",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                            ,0x81d,"int fy_fetch_value(struct fy_parser *, int)");
            }
            pcStack_e0 = (code *)0x1308ea;
            fy_parser_diag(fyp,0x20,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                           ,0x81f,"fy_fetch_value","--- parse_roll");
            pcStack_e0 = (code *)0x1308fe;
            iVar5 = fy_push_indent(fyp,indent,true);
            if (iVar5 != 0) {
              pcVar11 = "fy_push_indent() failed";
              iVar5 = 0x824;
              goto LAB_0013041f;
            }
            pcStack_e0 = (code *)0x130a28;
            fy_fill_atom_start(fyp,(fy_atom *)auStack_d8);
            pcStack_e0 = (code *)0x130a33;
            fy_fill_atom_end(fyp,(fy_atom *)auStack_d8);
            _drc.fyt = (fy_token *)sk_tl._lh.prev;
            _drc._20_4_ = indent;
            _drc._16_4_ = (fy_error_type)local_58;
            auStack_d8 = (undefined1  [8])sk_tl._lh.prev;
            _drc.module = indent;
            _drc.type = (fy_error_type)local_58;
            iVar5 = 0;
            pcStack_e0 = (code *)0x130a7a;
            pfVar8 = fy_token_queue_internal
                               (fyp,(fy_token_list *)local_90,FYTT_BLOCK_MAPPING_START,
                                (fy_atom *)auStack_d8);
            if (pfVar8 == (fy_token *)0x0) {
              pcVar11 = "fy_token_queue_internal() failed";
              line = 0x82e;
              goto LAB_00130494;
            }
            bVar4 = ((byte)local_38 | did_purge) & 1;
          }
          pfVar7 = (fy_atom *)auStack_d8;
          if (bVar4 != 0) {
            pfVar7 = (fy_atom *)local_118;
            iVar5 = 0;
            pfVar9 = fy_fill_atom(fyp,0,pfVar7);
            pfVar8 = fy_token_queue_internal(fyp,(fy_token_list *)local_90,FYTT_KEY,pfVar9);
            if (pfVar8 == (fy_token *)0x0) {
              pcVar11 = "fy_token_queue_internal() failed";
              line = 0x835;
              goto LAB_00130494;
            }
          }
          *(undefined8 *)&pfVar7[-1].increment = 0x130aa3;
          fyp_debug_dump_token(fyp,local_50,"insert-token: ");
          fytl = &fyp->queued_tokens;
          *(undefined8 *)&pfVar7[-1].increment = 0x130abf;
          fyp_debug_dump_token_list(fyp,fytl,local_50,"fyp->queued_tokens (before): ");
          *(undefined8 *)&pfVar7[-1].increment = 0x130ada;
          fyp_debug_dump_token_list(fyp,(fy_token_list *)local_90,(fy_token *)0x0,"sk_tl: ");
          plVar16 = sk_tl._lh.next;
          pfVar8 = (fy_token *)fytl;
          if ((local_50 == (fy_token *)0x0) || (pfVar8 = local_50, _n == (fy_simple_key *)0x0)) {
            if (local_90 != (undefined1  [8])local_90) goto LAB_00130aff;
          }
          else if (local_90 != (undefined1  [8])local_90) {
            pfVar8 = (fy_token *)(local_50->node).prev;
LAB_00130aff:
            plVar2 = (pfVar8->node).next;
            *(fy_token **)((long)local_90 + 8) = pfVar8;
            (pfVar8->node).next = (list_head *)local_90;
            plVar16->next = plVar2;
            plVar2->prev = plVar16;
          }
          *(undefined8 *)&pfVar7[-1].increment = 0x130b29;
          fyp_debug_dump_token_list(fyp,fytl,local_50,"fyp->queued_tokens (after): ");
          uVar15 = 0;
          if (_n == (fy_simple_key *)0x0) {
            uVar15 = (ushort)(fyp->flow_level == 0) << 3;
          }
          handle = &pfVar7[-2].increment;
          pfVar7[-2].fyi = (fy_input *)0x130b52;
          pfVar9 = fy_fill_atom(fyp,1,(fy_atom *)handle);
          iVar5 = 0;
          pfVar7[-2].fyi = (fy_input *)0x130b67;
          pfVar8 = fy_token_queue(fyp,FYTT_VALUE,pfVar9);
          if (pfVar8 != (fy_token *)0x0) {
            *(ushort *)&fyp->field_0x70 = (ushort)*(undefined4 *)&fyp->field_0x70 & 0xfff7 | uVar15;
            pcVar11 = "true";
            if (uVar15 == 0) {
              pcVar11 = "false";
            }
            pfVar7[-2].storage_hint = (size_t)pcVar11;
            pfVar7[-2].end_mark.line = 0x130bc4;
            pfVar7[-2].end_mark.column = 0;
            fy_parser_diag(fyp,0x20,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                           ,0x84f,"fy_fetch_value","simple_key_allowed -> %s\n");
            if (_n != (fy_simple_key *)0x0) {
              pfVar7[-2].fyi = (fy_input *)0x130bd8;
              fy_parse_simple_key_recycle(fyp,_n);
            }
            if (bVar14 != false) {
              fyp->pending_complex_key_column = -1;
              pfVar7[-2].storage_hint = 0xffffffff;
              pfVar7[-2].end_mark.line = 0x130c17;
              pfVar7[-2].end_mark.column = 0;
              fy_parser_diag(fyp,0x20,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                             ,0x857,"fy_fetch_value","pending_complex_key_column -> %d");
            }
            if (local_50 == (fy_token *)0x0) {
              return 0;
            }
            while( true ) {
              pfVar7[-2].fyi = (fy_input *)0x130c2a;
              iVar5 = fy_parse_peek_at_offset(fyp,0);
              if ((iVar5 != 9) && (iVar5 != 0x20)) break;
              pfVar7[-2].fyi = (fy_input *)0x130c3e;
              fy_advance(fyp,iVar5);
            }
            if (iVar5 != 0x23) {
              return 0;
            }
            pfVar7[-2].fyi = (fy_input *)0x130c5c;
            iVar5 = fy_scan_comment(fyp,local_50->comment + 1,false);
            if (iVar5 == 0) {
              return 0;
            }
            pcVar11 = "fy_scan_comment() failed";
            iVar5 = 0x863;
            goto LAB_0013041f;
          }
          pcVar11 = "fy_token_queue() failed";
          line = 0x84c;
          pfVar7 = (fy_atom *)handle;
        }
        else {
          pcVar11 = "fy_purge_stale_simple_keys() failed";
          _n = (fy_simple_key *)0x0;
          line = 0x7e3;
          pfVar7 = (fy_atom *)auStack_d8;
        }
LAB_00130494:
        *(undefined8 *)&pfVar7[-1].increment = 0x13049b;
        fy_parser_diag(fyp,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                       ,line,"fy_fetch_value",pcVar11);
        pfVar9 = pfVar7;
        goto LAB_001305c4;
      }
      _drc.type = FYET_DEBUG;
      _drc.module = FYEM_UNKNOWN;
      _drc.fyt = (fy_token *)0x0;
      _drc.has_override = false;
      _drc._17_7_ = 0;
      _drc.override_file = (char *)0x0;
      auStack_d8 = (undefined1  [8])0x200000004;
      pfVar7 = fy_fill_atom_at(fyp,0,1,(fy_atom *)local_118);
      _drc._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar7);
      pcVar11 = "wrongly indented mapping value in flow mode";
    }
    else {
      if (((fyp->current_input == (fy_input *)0x0) || ((fyp->current_input->field_0x74 & 1) == 0))
         || (fyp->flow == FYFT_MAP)) {
        if (fyp == (fy_parser *)0x0) goto LAB_0013042b;
        plVar16 = (list_head *)fyp->current_input_pos;
        local_58 = (ulong)(uint)fyp->line;
        pfVar12 = (fy_input *)(ulong)(uint)fyp->column;
        goto LAB_00130434;
      }
      _drc.type = FYET_DEBUG;
      _drc.module = FYEM_UNKNOWN;
      _drc.fyt = (fy_token *)0x0;
      _drc.has_override = false;
      _drc._17_7_ = 0;
      _drc.override_file = (char *)0x0;
      auStack_d8 = (undefined1  [8])0x200000004;
      pfVar7 = fy_fill_atom_at(fyp,0,1,(fy_atom *)local_118);
      _drc._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar7);
      pcVar11 = "JSON considers keys when not in mapping context invalid";
    }
    pfVar9 = (fy_atom *)local_118;
    _n = (fy_simple_key *)0x0;
    fy_parser_diag_report(fyp,(fy_diag_report_ctx *)auStack_d8,pcVar11);
  }
  else {
    pcVar11 = "illegal value mark";
    _n = (fy_simple_key *)0x0;
    iVar5 = 0x7d3;
LAB_0013041f:
    *(undefined8 *)(handle + -2) = 0x130426;
    fy_parser_diag(fyp,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                   ,iVar5,"fy_fetch_value",pcVar11);
    pfVar9 = (fy_atom *)handle;
  }
  iVar5 = -1;
LAB_001305c4:
  *(undefined8 *)((long)pfVar9 + -8) = 0x1305cf;
  fy_parse_simple_key_recycle(fyp,_n);
  return iVar5;
}

Assistant:

int fy_fetch_value(struct fy_parser *fyp, int c) {
    struct fy_token_list sk_tl;
    struct fy_simple_key *fysk = NULL;
    struct fy_mark mark, mark_insert, mark_end_insert;
    struct fy_token *fyt_insert, *fyt;
    struct fy_atom handle;
    bool target_simple_key_allowed, is_complex, has_bmap;
    bool push_bmap_start, push_key_only, did_purge, final_complex_key;
    bool is_multiline __FY_DEBUG_UNUSED__;
    int rc;

    fyp_error_check(fyp, c == ':', err_out,
                    "illegal value mark");

    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          !fyp_json_mode(fyp) || fyp->flow == FYFT_MAP, err_out,
                          "JSON considers keys when not in mapping context invalid");

    fy_get_mark(fyp, &mark);

    fy_token_list_init(&sk_tl);

    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          !fyp->flow_level || fyp->column > fyp->indent, err_out,
                          "wrongly indented mapping value in flow mode");

    rc = fy_purge_stale_simple_keys(fyp, &did_purge, FYTT_VALUE);
    fyp_error_check(fyp, !rc, err_out_rc,
                    "fy_purge_stale_simple_keys() failed");

    /* get the simple key (if available) for the value */
    fysk = fy_simple_key_list_head(&fyp->simple_keys);
    if (fysk && fysk->flow_level == fyp->flow_level)
        fy_simple_key_list_del(&fyp->simple_keys, fysk);
    else
        fysk = NULL;

    if (!fysk) {
        fyp_scan_debug(fyp, "no simple key flow_level=%d", fyp->flow_level);

        fyt_insert = fy_token_list_tail(&fyp->queued_tokens);
        mark_insert = mark;
        mark_end_insert = mark;
    } else {
        assert(fysk->possible);
        assert(fysk->flow_level == fyp->flow_level);
        fyt_insert = fysk->token;
        mark_insert = fysk->mark;
        mark_end_insert = fysk->end_mark;

        fyp_scan_debug(fyp, "have simple key flow_level=%d", fyp->flow_level);
    }

    fyp_scan_debug(fyp, "flow_level=%d, column=%d parse_indent=%d",
                   fyp->flow_level, mark_insert.column, fyp->indent);

    is_complex = fyp->pending_complex_key_column >= 0;
    final_complex_key = is_complex && (fyp->flow_level || fyp->column <= fyp->pending_complex_key_mark.column);
    is_multiline = mark_end_insert.line < fyp->line;
    has_bmap = fyp->generated_block_map;
    push_bmap_start = (!fyp->flow_level && mark_insert.column > fyp->indent);
    push_key_only = (!is_complex && (fyp->flow_level || has_bmap)) ||
                    (is_complex && !final_complex_key);

    fyp_scan_debug(fyp, "mark_insert.line=%d/%d mark_end_insert.line=%d/%d fyp->line=%d",
                   mark_insert.line, mark_insert.column,
                   mark_end_insert.line, mark_end_insert.column,
                   fyp->line);

    fyp_scan_debug(fyp,
                   "simple_key_allowed=%s is_complex=%s final_complex_key=%s is_multiline=%s has_bmap=%s push_bmap_start=%s push_key_only=%s",
                   fyp->simple_key_allowed ? "true" : "false",
                   is_complex ? "true" : "false",
                   final_complex_key ? "true" : "false",
                   is_multiline ? "true" : "false",
                   has_bmap ? "true" : "false",
                   push_bmap_start ? "true" : "false",
                   push_key_only ? "true" : "false");

    if (!is_complex && is_multiline && (!fyp->flow_level || fyp->flow != FYFT_MAP)) {
        FYP_PARSE_ERROR(fyp, 0, 1, FYEM_SCAN, "Illegal placement of ':' indicator");
        goto err_out;
    }

    if (push_bmap_start) {

        assert(!fyp->flow_level);

        fyp_scan_debug(fyp, "--- parse_roll");

        /* push the new indent level */
        rc = fy_push_indent(fyp, mark_insert.column, true);
        fyp_error_check(fyp, !rc, err_out_rc,
                        "fy_push_indent() failed");

        fy_fill_atom_start(fyp, &handle);
        fy_fill_atom_end(fyp, &handle);

        handle.start_mark = handle.end_mark = mark_insert;

        /* and the block mapping start */
        fyt = fy_token_queue_internal(fyp, &sk_tl, FYTT_BLOCK_MAPPING_START, &handle);
        fyp_error_check(fyp, fyt, err_out_rc,
                        "fy_token_queue_internal() failed");
    }

    if (push_bmap_start || push_key_only) {

        fyt = fy_token_queue_internal(fyp, &sk_tl, FYTT_KEY, fy_fill_atom_a(fyp, 0));
        fyp_error_check(fyp, fyt, err_out_rc,
                        "fy_token_queue_internal() failed");

    }

    fyp_debug_dump_token(fyp, fyt_insert, "insert-token: ");
    fyp_debug_dump_token_list(fyp, &fyp->queued_tokens, fyt_insert, "fyp->queued_tokens (before): ");
    fyp_debug_dump_token_list(fyp, &sk_tl, NULL, "sk_tl: ");

    if (fyt_insert) {

        if (fysk)
            fy_token_list_splice_before(&fyp->queued_tokens, fyt_insert, &sk_tl);
        else
            fy_token_list_splice_after(&fyp->queued_tokens, fyt_insert, &sk_tl);
    } else
        fy_token_lists_splice(&fyp->queued_tokens, &sk_tl);

    fyp_debug_dump_token_list(fyp, &fyp->queued_tokens, fyt_insert, "fyp->queued_tokens (after): ");

    target_simple_key_allowed = fysk ? false : !fyp->flow_level;

    fyt = fy_token_queue(fyp, FYTT_VALUE, fy_fill_atom_a(fyp, 1));
    fyp_error_check(fyp, fyt, err_out_rc,
                    "fy_token_queue() failed");

    fyp->simple_key_allowed = target_simple_key_allowed;
    fyp_scan_debug(fyp, "simple_key_allowed -> %s\n", fyp->simple_key_allowed ? "true" : "false");

    if (fysk)
        fy_parse_simple_key_recycle(fyp, fysk);

    if (final_complex_key) {
        fyp->pending_complex_key_column = -1;
        fyp_scan_debug(fyp, "pending_complex_key_column -> %d",
                       fyp->pending_complex_key_column);
    }

    if (fyt_insert) {
        /* eat whitespace */
        while (fy_is_blank(c = fy_parse_peek(fyp)))
            fy_advance(fyp, c);

        /* comment? */
        if (c == '#') {
            rc = fy_scan_comment(fyp, &fyt_insert->comment[fycp_right], false);
            fyp_error_check(fyp, !rc, err_out_rc,
                            "fy_scan_comment() failed");
        }
    }

    return 0;

    err_out:
    rc = -1;
    err_out_rc:
    fy_parse_simple_key_recycle(fyp, fysk);
    return rc;
}